

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

uint8_t get_image_version(FILE *fp)

{
  undefined8 in_RAX;
  size_t sVar1;
  long __off;
  uint8_t uVar2;
  uint8_t header [5];
  
  _header = in_RAX;
  sVar1 = fread(header,5,1,(FILE *)fp);
  if ((int)sVar1 != 1) {
    error_impl("get_image_version",0x40b,"get_image_version(): Unable to read version header data!")
    ;
  }
  if (header._0_4_ == 0x2174736c) {
    if (2 < header[4]) {
      return header[4];
    }
    __off = 8;
    uVar2 = header[4];
  }
  else {
    __off = 0;
    uVar2 = '\0';
  }
  fseek((FILE *)fp,__off,0);
  return uVar2;
}

Assistant:

uint8_t get_image_version(FILE *fp)
{
    uint8_t header[IMAGE_HEADER_SIZE];
    int rc;

    rc = (int)fread(&header, sizeof(header), 1, fp);

    if(rc != 1) {
        error("get_image_version(): Unable to read version header data!");
    }

    if(header[0] == 'l' && header[1] == 's' && header[2] == 't' && header[3] == '!') {
        uint8_t ver = header[4];

        if(ver <= IMAGE_VERSION_2) {
            /* old version, seek past the extra 3 bytes. */
            fseek(fp, IMAGE_HEADER_SIZE_OLD, SEEK_SET);
        }

        return ver;
    } else {
        /* not a version with a header, seek back to the start. */
        fseek(fp, 0, SEEK_SET);
        return 0;
    }
}